

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_patterns
                 (lysc_ctx *ctx,lysp_restr *patterns_p,lysc_pattern **base_patterns,
                 lysc_pattern ***patterns)

{
  LY_ERR LVar1;
  lysc_pattern **pplVar2;
  lysc_pattern *plVar3;
  void *local_100;
  lysp_ext_instance *local_e0;
  lysp_ext_instance *local_d0;
  lysp_ext_instance *local_b8;
  lysp_ext_instance *local_a8;
  void *local_88;
  void *local_80;
  lysp_ext_instance *local_78;
  long *local_68;
  char *p___1;
  uint64_t __u;
  undefined8 *puStack_50;
  LY_ERR ret__;
  char *p__;
  lysp_ext_instance *plStack_40;
  LY_ERR ret;
  uint64_t u;
  lysc_pattern **pattern;
  lysc_pattern ***patterns_local;
  lysc_pattern **base_patterns_local;
  lysp_restr *patterns_p_local;
  lysc_ctx *ctx_local;
  
  p__._4_4_ = LY_SUCCESS;
  if (base_patterns != (lysc_pattern **)0x0) {
    pplVar2 = lysc_patterns_dup(ctx->ctx,base_patterns);
    *patterns = pplVar2;
    if (*patterns == (lysc_pattern **)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_type_patterns");
      return LY_EMEM;
    }
  }
  plStack_40 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (patterns_p == (lysp_restr *)0x0) {
      local_78 = (lysp_ext_instance *)0x0;
    }
    else {
      local_78 = patterns_p[-1].exts;
    }
    if (local_78 <= plStack_40) {
      return p__._4_4_;
    }
    if (*patterns == (lysc_pattern **)0x0) {
      puStack_50 = (undefined8 *)malloc(0x10);
      if (puStack_50 == (undefined8 *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_type_patterns");
        return LY_EMEM;
      }
      *puStack_50 = 1;
    }
    else {
      (*patterns)[-1] = (lysc_pattern *)((long)&(*patterns)[-1]->expr + 1);
      puStack_50 = (undefined8 *)realloc(*patterns + -1,(long)(*patterns)[-1] * 8 + 8);
      if (puStack_50 == (undefined8 *)0x0) {
        (*patterns)[-1] = (lysc_pattern *)&(*patterns)[-1][-1].field_0x3f;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_type_patterns");
        return LY_EMEM;
      }
    }
    *patterns = (lysc_pattern **)(puStack_50 + 1);
    pplVar2 = *patterns + (long)&(*patterns)[-1][-1].field_0x3f;
    memset(pplVar2,0,8);
    plVar3 = (lysc_pattern *)calloc(1,0x40);
    *pplVar2 = plVar3;
    plVar3 = *pplVar2;
    *(uint *)&plVar3->field_0x38 =
         *(uint *)&plVar3->field_0x38 & 1 | ((*(uint *)&plVar3->field_0x38 >> 1) + 1) * 2;
    LVar1 = lys_compile_type_pattern_check
                      (ctx->ctx,patterns_p[(long)plStack_40].arg.str + 1,&(*pplVar2)->code);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (*patterns_p[(long)plStack_40].arg.str == '\x15') {
      *(uint *)&(*pplVar2)->field_0x38 = *(uint *)&(*pplVar2)->field_0x38 & 0xfffffffe | 1;
    }
    LVar1 = lydict_insert(ctx->ctx,patterns_p[(long)plStack_40].arg.str + 1,0,&(*pplVar2)->expr);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lydict_dup(ctx->ctx,patterns_p[(long)plStack_40].eapptag,&(*pplVar2)->eapptag);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lydict_dup(ctx->ctx,patterns_p[(long)plStack_40].emsg,&(*pplVar2)->emsg);
    if (LVar1 != LY_SUCCESS) break;
    LVar1 = lydict_dup(ctx->ctx,patterns_p[(long)plStack_40].dsc,&(*pplVar2)->dsc);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lydict_dup(ctx->ctx,patterns_p[(long)plStack_40].ref,&(*pplVar2)->ref);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    p__._4_4_ = LY_SUCCESS;
    if (patterns_p[(long)plStack_40].exts != (lysp_ext_instance *)0x0) {
      if ((*pplVar2)->exts == (lysc_ext_instance *)0x0) {
        local_88 = (void *)0x0;
      }
      else {
        if ((*pplVar2)->exts == (lysc_ext_instance *)0x0) {
          local_80 = (void *)0x0;
        }
        else {
          local_80 = (*pplVar2)->exts[-1].compiled;
        }
        local_88 = local_80;
      }
      if ((*pplVar2)->exts == (lysc_ext_instance *)0x0) {
        if (patterns_p[(long)plStack_40].exts == (lysp_ext_instance *)0x0) {
          local_b8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_b8 = patterns_p[(long)plStack_40].exts[-1].exts;
        }
        local_68 = (long *)calloc(1,((long)local_88 + (long)local_b8) * 0x48 + 8);
        if (local_68 == (long *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_patterns");
          return LY_EMEM;
        }
      }
      else {
        if (patterns_p[(long)plStack_40].exts == (lysp_ext_instance *)0x0) {
          local_a8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_a8 = patterns_p[(long)plStack_40].exts[-1].exts;
        }
        local_68 = (long *)realloc(&(*pplVar2)->exts[-1].compiled,
                                   ((long)(*pplVar2)->exts[-1].compiled +
                                   (long)local_88 + (long)local_a8) * 0x48 + 8);
        if (local_68 == (long *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_patterns");
          return LY_EMEM;
        }
      }
      (*pplVar2)->exts = (lysc_ext_instance *)(local_68 + 1);
      if ((*pplVar2)->exts != (lysc_ext_instance *)0x0) {
        if (patterns_p[(long)plStack_40].exts == (lysp_ext_instance *)0x0) {
          local_d0 = (lysp_ext_instance *)0x0;
        }
        else {
          local_d0 = patterns_p[(long)plStack_40].exts[-1].exts;
        }
        memset((*pplVar2)->exts + *local_68,0,((long)local_88 + (long)local_d0) * 0x48);
      }
      p___1 = (char *)0x0;
      while( true ) {
        if (patterns_p[(long)plStack_40].exts == (lysp_ext_instance *)0x0) {
          local_e0 = (lysp_ext_instance *)0x0;
        }
        else {
          local_e0 = patterns_p[(long)plStack_40].exts[-1].exts;
        }
        if (local_e0 <= p___1) break;
        (*pplVar2)->exts[-1].compiled = (void *)((long)(*pplVar2)->exts[-1].compiled + 1);
        if ((*pplVar2)->exts == (lysc_ext_instance *)0x0) {
          local_100 = (void *)0x0;
        }
        else {
          local_100 = (*pplVar2)->exts[-1].compiled;
        }
        p__._4_4_ = lys_compile_ext(ctx,patterns_p[(long)plStack_40].exts + (long)p___1,
                                    (*pplVar2)->exts + (long)local_100 + -1,*pplVar2);
        if (p__._4_4_ == LY_ENOT) {
          (*pplVar2)->exts[-1].compiled = (void *)((long)(*pplVar2)->exts[-1].compiled + -1);
          p__._4_4_ = LY_SUCCESS;
        }
        else if (p__._4_4_ != LY_SUCCESS) {
          return p__._4_4_;
        }
        p___1 = p___1 + 1;
      }
    }
    plStack_40 = (lysp_ext_instance *)((long)&plStack_40->name + 1);
  }
  return LVar1;
}

Assistant:

LY_ERR
lys_compile_type_patterns(struct lysc_ctx *ctx, const struct lysp_restr *patterns_p, struct lysc_pattern **base_patterns,
        struct lysc_pattern ***patterns)
{
    struct lysc_pattern **pattern;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    /* first, copy the patterns from the base type */
    if (base_patterns) {
        *patterns = lysc_patterns_dup(ctx->ctx, base_patterns);
        LY_CHECK_ERR_RET(!(*patterns), LOGMEM(ctx->ctx), LY_EMEM);
    }

    LY_ARRAY_FOR(patterns_p, u) {
        LY_ARRAY_NEW_RET(ctx->ctx, (*patterns), pattern, LY_EMEM);
        *pattern = calloc(1, sizeof **pattern);
        ++(*pattern)->refcount;

        ret = lys_compile_type_pattern_check(ctx->ctx, &patterns_p[u].arg.str[1], &(*pattern)->code);
        LY_CHECK_RET(ret);

        if (patterns_p[u].arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
            (*pattern)->inverted = 1;
        }
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, &patterns_p[u].arg.str[1], 0, &(*pattern)->expr), done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].eapptag, (*pattern)->eapptag, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].emsg, (*pattern)->emsg, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].dsc, (*pattern)->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, patterns_p[u].ref, (*pattern)->ref, ret, done);
        COMPILE_EXTS_GOTO(ctx, patterns_p[u].exts, (*pattern)->exts, (*pattern), ret, done);
    }
done:
    return ret;
}